

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O1

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::~tag_scalar_t(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_0013e418;
  pcVar2 = (this->m_value)._M_dataplus._M_p;
  paVar1 = &(this->m_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tag_t<cfgfile::string_trait_t>::~tag_t(&this->super_tag_t<cfgfile::string_trait_t>);
  return;
}

Assistant:

~tag_scalar_t()
	{
	}